

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_wbuf.c
# Opt level: O1

void lj_wbuf_flush(lj_wbuf *buf)

{
  uint8_t *puVar1;
  size_t sVar2;
  int *piVar3;
  ulong uVar4;
  
  if ((buf->flags & 2) == 0) {
    uVar4 = (long)buf->pos - (long)buf->buf;
    sVar2 = (*buf->writer)(&buf->buf,uVar4,buf->ctx);
    if (sVar2 < uVar4) {
      buf->flags = buf->flags | 1;
      piVar3 = __errno_location();
      buf->saved_errno = *piVar3;
    }
    puVar1 = buf->buf;
    if (puVar1 == (uint8_t *)0x0) {
      buf->flags = buf->flags | 2;
      piVar3 = __errno_location();
      buf->saved_errno = *piVar3;
    }
    buf->pos = puVar1;
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_wbuf_flush(struct lj_wbuf *buf)
{
  const size_t len = wbuf_len(buf);
  size_t written;

  if (LJ_UNLIKELY(lj_wbuf_test_flag(buf, STREAM_STOP)))
    return;

  written = buf->writer((const void **)&buf->buf, len, buf->ctx);

  if (LJ_UNLIKELY(written < len)) {
    wbuf_set_flag(buf, STREAM_ERRIO);
    wbuf_save_errno(buf);
  }
  if (LJ_UNLIKELY(buf->buf == NULL)) {
    wbuf_set_flag(buf, STREAM_STOP);
    wbuf_save_errno(buf);
  }
  buf->pos = buf->buf;
}